

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O2

bool __thiscall NanoVM::fetch(NanoVM *this,Instruction *inst)

{
  ulong uVar1;
  ulong uVar2;
  uchar *puVar3;
  ulong uVar4;
  byte bVar5;
  ostream *poVar6;
  byte bVar7;
  
  uVar1 = (this->cpu).registers[8];
  uVar2 = (this->cpu).codeSize;
  if (uVar1 < uVar2) {
    puVar3 = (this->cpu).codeBase;
    uVar4 = *(ulong *)(puVar3 + uVar1);
    inst->opcode = (byte)uVar4 & 0x1f;
    inst->dstReg = (byte)((uVar4 & 0xffffffff) >> 5) & 7;
    bVar5 = (byte)(uVar4 >> 8);
    bVar7 = (byte)(uVar4 >> 0xd) & 3;
    inst->srcType = bVar5 & 0x80;
    inst->srcReg = bVar5 & 7;
    inst->srcSize = bVar7;
    inst->isDstMem = (bool)((byte)(uVar4 >> 0xc) & 1);
    inst->isSrcMem = (bool)((byte)(uVar4 >> 0xb) & 1);
    if ((uVar4 & 0x8000) == 0) {
      inst->instructionSize = '\x02';
    }
    else {
      switch(bVar7) {
      case 0:
        inst->immediate = (ulong)((uint)uVar4 >> 0x10 & 0xff);
        inst->instructionSize = '\x03';
        break;
      case 1:
        inst->immediate = (ulong)((uint)uVar4 >> 0x10);
        inst->instructionSize = '\x04';
        break;
      case 2:
        inst->immediate = uVar4 >> 0x10 & 0xffffffff;
        inst->instructionSize = '\x06';
        break;
      case 3:
        inst->immediate = *(uint64_t *)(puVar3 + uVar1 + 2);
        inst->instructionSize = '\n';
      }
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"IP out of bounds");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  return uVar1 < uVar2;
}

Assistant:

bool NanoVM::fetch(Instruction &inst) const {
	// Read 64bit to try and minimize the required memory reading
	// This increases the performance

	// Sanity check the ip that it is within code page
	if (cpu.registers[ip] >= cpu.codeSize) {
		std::cout << "IP out of bounds" << std::endl;
		return false;
	}
	// Parse the instruction
	unsigned char* rawIp = cpu.codeBase + cpu.registers[ip];
	uint64_t value = *reinterpret_cast<uint64_t*>(rawIp);
	inst.opcode   =  (value & (unsigned char)OPCODE_MASK);
	inst.dstReg   =  ((value & DST_REG_MASK) >> 5);
	inst.srcType  =  (value >> 8) & SRC_TYPE_MASK;
	inst.srcReg   =   (value >> 8) & SRC_REG_MASK;
	inst.srcSize  =  ((value >> 8) & SRC_SIZE_MASK) >> 5;
	inst.isDstMem =  ((value >> 8) & DST_MEM_MASK);
	inst.isSrcMem =  ((value >> 8) & SRC_MEM_MASK);
	// If source is immediate value, read it to the instruction struct
	if (inst.srcType) {
		// If the immediate value fit in the initial value. Parse it with bitshift. It is faster than reading memory again
		switch (inst.srcSize) {
		case Byte:
			inst.immediate = (uint8_t)(value >> 16);
			inst.instructionSize = 3;
			break;
		case Short:
			inst.immediate = (uint16_t)(value >> 16);
			inst.instructionSize = 4;
			break;
		case Dword:
			inst.immediate = (uint32_t)(value >> 16);
			inst.instructionSize = 6;
			break;
		case Qword:
			// In the case of qword we have to perform another read operations
			inst.immediate = *(uint64_t*)(rawIp + 2);
			inst.instructionSize = 10;
			break;
		}
	}
	else {
		inst.instructionSize = 2;
	}
	return true;

}